

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::queryIndexedState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  byte bVar1;
  char *pcVar2;
  GLboolean v;
  bool bVar3;
  int i_1;
  long lVar4;
  StateQueryMemoryWriteGuard<unsigned_char[4]> value_3;
  StateQueryMemoryWriteGuard<unsigned_char> value;
  ostringstream buf;
  StateQueryMemoryWriteGuard<unsigned_char[4]> local_368;
  long *local_358;
  long local_350;
  long local_348 [2];
  QueriedState *local_338;
  Hex<2UL> local_330;
  undefined1 local_328 [32];
  void *local_308;
  long lStack_300;
  GLint64 local_2f8;
  GLint64 GStack_2f0;
  long local_2e8;
  long lStack_2e0;
  long local_2d8;
  long lStack_2d0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [376];
  
  switch(type) {
  case QUERY_INDEXED_BOOLEAN:
    local_328._0_3_ = 0xdedede;
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,local_328 + 1);
    bVar3 = checkError(result,gl,"glGetBooleani_v");
    if (!bVar3) {
      return;
    }
    bVar3 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char> *)local_328,result);
    if (!bVar3) {
      return;
    }
    bVar3 = verifyBooleanValidity(result,local_328[1]);
    if (!bVar3) {
      return;
    }
    v = local_328[1];
    goto LAB_0185a5eb;
  case QUERY_INDEXED_BOOLEAN_VEC4:
    local_368.m_preguard[0] = 0xde;
    local_368.m_preguard[1] = 0xde;
    local_368.m_preguard[2] = 0xde;
    local_368.m_preguard[3] = 0xde;
    local_368.m_value[0] = 0xde;
    local_368.m_value[1] = 0xde;
    local_368.m_value[2] = 0xde;
    local_368.m_value[3] = 0xde;
    local_368.m_postguard[0] = 0xde;
    local_368.m_postguard[1] = 0xde;
    local_368.m_postguard[2] = 0xde;
    local_368.m_postguard[3] = 0xde;
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,local_368.m_value);
    bVar3 = checkError(result,gl,"glGetBooleani_v");
    if (!bVar3) {
      return;
    }
    bVar3 = StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity(&local_368,result);
    if (!bVar3) {
      return;
    }
    bVar3 = true;
    lVar4 = 0;
    do {
      if (1 < local_368.m_value[lVar4]) {
        bVar3 = false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (!bVar3) {
      local_338 = state;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Boolean vec4 value was not neither GL_TRUE nor GL_FALSE, got (",0x3e);
      lVar4 = 0;
      do {
        pcVar2 = " , ";
        if (lVar4 == 0) {
          pcVar2 = glcts::fixed_sample_locations_values;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(bool *)pcVar2 + 1,(ulong)((uint)(lVar4 != 0) * 2));
        bVar1 = local_368.m_value[lVar4];
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        local_330.value = (ulong)bVar1;
        tcu::Format::Hex<2UL>::toStream(&local_330,(ostream *)local_328);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_358,local_350);
        if (local_358 != local_348) {
          operator_delete(local_358,local_348[0] + 1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      std::__cxx11::stringbuf::str();
      state = local_338;
      tcu::ResultCollector::fail(result,(string *)local_328);
      if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (!bVar3) {
        return;
      }
    }
    lVar4 = 0;
    do {
      local_328[lVar4] = local_368.m_value[lVar4] == '\x01';
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    state->m_type = DATATYPE_BOOLEAN_VEC4;
    local_328._4_4_ = local_328._0_4_;
    goto LAB_0185a865;
  case QUERY_INDEXED_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabledi(gl,target,index);
    bVar3 = checkError(result,gl,"glIsEnabledi");
    if (!bVar3) {
      return;
    }
    bVar3 = verifyBooleanValidity(result,v);
    if (!bVar3) {
      return;
    }
LAB_0185a5eb:
    state->m_type = DATATYPE_BOOLEAN;
    (state->m_v).vBool = v == '\x01';
    break;
  case QUERY_INDEXED_INTEGER:
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_4_ = -0x21212122;
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,(GLint *)(local_328 + 4));
    bVar3 = checkError(result,gl,"glGetIntegeri_v");
    if (!bVar3) {
      return;
    }
    bVar3 = StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)local_328,result);
    if (!bVar3) {
      return;
    }
    state->m_type = DATATYPE_INTEGER;
LAB_0185a865:
    (state->m_v).vInt = local_328._4_4_;
    break;
  case QUERY_INDEXED_INTEGER_VEC4:
    local_308 = (void *)0xdededededededede;
    lStack_300 = -0x2121212121212122;
    local_328._16_8_ = (void *)0xdededededededede;
    local_328._24_8_ = -0x2121212121212122;
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_8_ = 0xdededededededede;
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,(GLint *)(local_328 + 0x10));
    bVar3 = checkError(result,gl,"glGetIntegeri_v");
    if ((bVar3) &&
       (bVar3 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[4]> *)local_328,result), bVar3)) {
      state->m_type = DATATYPE_INTEGER_VEC4;
      (state->m_v).vPtr = (void *)local_328._16_8_;
      (state->m_v).vInt64Vec4[1] = local_328._24_8_;
    }
    break;
  case QUERY_INDEXED_INTEGER64:
    local_328._16_8_ = 0xdededededededede;
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_8_ = (void *)0xdededededededede;
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,(GLint64 *)(local_328 + 8));
    bVar3 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar3) &&
       (bVar3 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_328,result), bVar3)) {
      state->m_type = DATATYPE_INTEGER64;
      (state->m_v).vPtr = (void *)local_328._8_8_;
    }
    break;
  case QUERY_INDEXED_INTEGER64_VEC4:
    local_2d8 = -0x2121212121212122;
    lStack_2d0 = -0x2121212121212122;
    local_2e8 = -0x2121212121212122;
    lStack_2e0 = -0x2121212121212122;
    local_2f8 = -0x2121212121212122;
    GStack_2f0 = -0x2121212121212122;
    local_308 = (void *)0xdededededededede;
    lStack_300 = -0x2121212121212122;
    local_328._16_8_ = 0xdededededededede;
    local_328._24_4_ = -0x21212122;
    local_328._28_4_ = -0x21212122;
    local_328._0_8_ = (pointer)0xdededededededede;
    local_328._8_8_ = 0xdededededededede;
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,(GLint64 *)&local_308);
    bVar3 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar3) &&
       (bVar3 = StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long[4]> *)local_328,result), bVar3)) {
      state->m_type = DATATYPE_INTEGER64_VEC4;
      (state->m_v).vPtr = local_308;
      (state->m_v).vInt64Vec4[1] = lStack_300;
      (state->m_v).vInt64Vec4[2] = local_2f8;
      (state->m_v).vInt64Vec4[3] = GStack_2f0;
    }
  }
  return;
}

Assistant:

void queryIndexedState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_INDEXED_BOOLEAN_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean[4]> value;
			gl.glGetBooleani_v(target, index, value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			if (!verifyBooleanVec4Validity(result, value))
				return;

			{
				bool res[4];

				for (int i = 0; i < 4; i++)
					res[i] = value[i] == GL_TRUE;

				state = QueriedState(res);
			}

			break;
		}

		case QUERY_INDEXED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetIntegeri_v(target, index, value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint64[4]> value;
			gl.glGetInteger64i_v(target, index, value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabledi(target, index);

			if (!checkError(result, gl, "glIsEnabledi"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleani_v(target, index, &value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegeri_v(target, index, &value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64i_v(target, index, &value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}